

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
cmExportBuildFileGenerator::FindBuildExportInfo
          (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGlobalGenerator *gg,
          string *name)

{
  pointer pTVar1;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  bool bVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
  __it;
  __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
  __it_00;
  TargetExport *pTVar6;
  long lVar7;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  string ns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exportFiles;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  local_b8;
  long *local_98 [2];
  long local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  p_Var5 = (gg->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(gg->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_40 = __return_storage_ptr__;
  if (p_Var5 != local_38) {
    do {
      local_b8.
      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ._M_impl.super__Vector_impl_data._M_start = (TargetExport *)0x0;
      local_b8.
      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ._M_impl.super__Vector_impl_data._M_finish = (TargetExport *)0x0;
      local_b8.
      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetTargets(*(cmExportBuildFileGenerator **)(p_Var5 + 2),&local_b8);
      pTVar1 = local_b8.
               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar4 = (long)local_b8.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      __it._M_current =
           local_b8.
           super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar4 >> 8) {
        pTVar6 = (TargetExport *)
                 ((long)&((local_b8.
                           super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                           ._M_impl.super__Vector_impl_data._M_start)->Name)._M_dataplus._M_p +
                 (uVar4 & 0xffffffffffffff00));
        lVar7 = ((long)uVar4 >> 8) + 1;
        __it_00._M_current =
             local_b8.
             super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
             ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)name,__it_00);
          __it._M_current = __it_00._M_current;
          if (bVar3) goto LAB_004239a1;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)name,__it_00._M_current + 1);
          __it._M_current = __it_00._M_current + 1;
          if (bVar3) goto LAB_004239a1;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)name,__it_00._M_current + 2);
          __it._M_current = __it_00._M_current + 2;
          if (bVar3) goto LAB_004239a1;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)name,__it_00._M_current + 3);
          __it._M_current = __it_00._M_current + 3;
          if (bVar3) goto LAB_004239a1;
          __it_00._M_current = __it_00._M_current + 4;
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
        uVar4 = (long)pTVar1 - (long)pTVar6;
        __it._M_current = pTVar6;
      }
      lVar7 = (long)uVar4 >> 6;
      if (lVar7 == 1) {
LAB_00423988:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                              *)name,__it);
        if (!bVar3) {
          __it._M_current = pTVar1;
        }
LAB_004239a1:
        if (__it._M_current != pTVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_58,(value_type *)(p_Var5 + 1));
          lVar7 = *(long *)(*(long *)(p_Var5 + 2) + 8);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,lVar7,*(long *)(*(long *)(p_Var5 + 2) + 0x10) + lVar7);
          std::__cxx11::string::operator=((string *)&local_78,(string *)local_98);
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
        }
      }
      else {
        if (lVar7 == 2) {
LAB_0042395c:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)name,__it);
          if (!bVar3) {
            __it._M_current = __it._M_current + 1;
            goto LAB_00423988;
          }
          goto LAB_004239a1;
        }
        if (lVar7 == 3) {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)name,__it);
          if (!bVar3) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0042395c;
          }
          goto LAB_004239a1;
        }
      }
      std::
      vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ::~vector(&local_b8);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_38);
  }
  ppVar2 = local_40;
  std::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_40,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return ppVar2;
}

Assistant:

std::pair<std::vector<std::string>, std::string>
cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator* gg,
                                                const std::string& name)
{
  std::vector<std::string> exportFiles;
  std::string ns;

  auto& exportSets = gg->GetBuildExportSets();

  for (auto const& exp : exportSets) {
    const auto& exportSet = exp.second;
    std::vector<TargetExport> targets;
    exportSet->GetTargets(targets);
    if (std::any_of(
          targets.begin(), targets.end(),
          [&name](const TargetExport& te) { return te.Name == name; })) {
      exportFiles.push_back(exp.first);
      ns = exportSet->GetNamespace();
    }
  }

  return { exportFiles, ns };
}